

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search.cpp
# Opt level: O1

int si9ma::BinarySearch::find_local_min(int *arr,int L,int R)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  undefined8 *puVar4;
  int iVar5;
  uint uVar6;
  
  if (R < L) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "invalid length";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  iVar2 = L;
  if (((R != L) && (arr[(long)L + 1] <= arr[L])) &&
     (uVar3 = (ulong)R, iVar2 = R, arr[uVar3 - 1] <= arr[uVar3])) {
    do {
      iVar5 = (R - L) / 2;
      uVar6 = iVar5 + L;
      iVar2 = arr[(int)uVar6];
      if ((iVar2 < arr[(long)(int)uVar6 + -1]) && (bVar1 = true, iVar2 < arr[(long)(int)uVar6 + 1]))
      {
        uVar3 = (ulong)uVar6;
      }
      else {
        if (arr[(long)(int)uVar6 + -1] < iVar2) {
          R = iVar5 + L + -1;
        }
        else {
          L = uVar6 + 1;
        }
        bVar1 = false;
      }
      iVar2 = (int)uVar3;
    } while (!bVar1);
  }
  return iVar2;
}

Assistant:

int BinarySearch::find_local_min(int *arr, int L,int R) {
        if(R < L)
            throw "invalid length";

        if(L == R)
            return L;

        if(arr[L] < arr[L + 1])
            return L;

        if(arr[R] < arr[R - 1])
            return R;

        while (L <= R){
            int mid = L + (R - L)/2;

            if(arr[mid] < arr[mid - 1] && arr[mid] < arr[mid + 1])
                return mid;

            if(arr[mid] > arr[mid - 1]){
                R = mid - 1;
                continue;
            }

            L = mid + 1;
        }
    }